

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpmultipart.cpp
# Opt level: O0

void __thiscall QHttpMultiPartPrivate::~QHttpMultiPartPrivate(QHttpMultiPartPrivate *this)

{
  QObjectPrivate *in_RDI;
  
  *(undefined ***)in_RDI = &PTR__QHttpMultiPartPrivate_0049dce0;
  if (*(long **)(in_RDI + 0xb0) != (long *)0x0) {
    (**(code **)(**(long **)(in_RDI + 0xb0) + 0x20))();
  }
  QByteArray::~QByteArray((QByteArray *)0x2e40c1);
  QList<QHttpPart>::~QList((QList<QHttpPart> *)0x2e40ce);
  QObjectPrivate::~QObjectPrivate(in_RDI);
  return;
}

Assistant:

QHttpMultiPartPrivate::~QHttpMultiPartPrivate()
{
    delete device;
}